

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

int mbedtls_ssl_parse_finished(mbedtls_ssl_context *ssl)

{
  uchar *puVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  uchar local_2c [8];
  uchar buf [12];
  uint hash_len;
  int ret;
  mbedtls_ssl_context *ssl_local;
  
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
             ,0x1425,"=> parse finished");
  (*ssl->handshake->calc_finished)(ssl,local_2c,*(uint *)&ssl->conf->field_0x174 & 1 ^ 1);
  buf._8_4_ = mbedtls_ssl_read_record(ssl);
  if (buf._8_4_ == 0) {
    if (ssl->in_msgtype == 0x16) {
      buf[4] = '\f';
      buf[5] = '\0';
      buf[6] = '\0';
      buf[7] = '\0';
      if ((*ssl->in_msg == '\x14') &&
         (sVar4 = ssl->in_hslen, sVar3 = mbedtls_ssl_hs_hdr_len(ssl),
         sVar4 == sVar3 + (uint)buf._4_4_)) {
        puVar1 = ssl->in_msg;
        sVar4 = mbedtls_ssl_hs_hdr_len(ssl);
        iVar2 = mbedtls_ssl_safer_memcmp(puVar1 + sVar4,local_2c,(ulong)(uint)buf._4_4_);
        if (iVar2 == 0) {
          ssl->verify_data_len = (ulong)(uint)buf._4_4_;
          memcpy(ssl->peer_verify_data,local_2c,(ulong)(uint)buf._4_4_);
          if (ssl->handshake->resume == 0) {
            ssl->state = ssl->state + 1;
          }
          else {
            if ((*(uint *)&ssl->conf->field_0x174 & 1) == 0) {
              ssl->state = 10;
            }
            if ((*(uint *)&ssl->conf->field_0x174 & 1) == 1) {
              ssl->state = 0xf;
            }
          }
          if ((*(uint *)&ssl->conf->field_0x174 >> 1 & 1) == 1) {
            mbedtls_ssl_recv_flight_completed(ssl);
          }
          mbedtls_debug_print_msg
                    (ssl,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                     ,0x1463,"<= parse finished");
          ssl_local._4_4_ = 0;
        }
        else {
          mbedtls_debug_print_msg
                    (ssl,1,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                     ,0x1447,"bad finished message");
          ssl_local._4_4_ = -0x7e80;
        }
      }
      else {
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                   ,0x1440,"bad finished message");
        ssl_local._4_4_ = -0x7e80;
      }
    }
    else {
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                 ,0x1431,"bad finished message");
      ssl_local._4_4_ = -0x7700;
    }
  }
  else {
    mbedtls_debug_print_ret
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
               ,0x142b,"mbedtls_ssl_read_record",buf._8_4_);
    ssl_local._4_1_ = buf[8];
    ssl_local._5_1_ = buf[9];
    ssl_local._6_1_ = buf[10];
    ssl_local._7_1_ = buf[0xb];
  }
  return ssl_local._4_4_;
}

Assistant:

int mbedtls_ssl_parse_finished( mbedtls_ssl_context *ssl )
{
    int ret;
    unsigned int hash_len;
    unsigned char buf[SSL_MAX_HASH_LEN];

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> parse finished" ) );

    ssl->handshake->calc_finished( ssl, buf, ssl->conf->endpoint ^ 1 );

    if( ( ret = mbedtls_ssl_read_record( ssl ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_read_record", ret );
        return( ret );
    }

    if( ssl->in_msgtype != MBEDTLS_SSL_MSG_HANDSHAKE )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad finished message" ) );
        return( MBEDTLS_ERR_SSL_UNEXPECTED_MESSAGE );
    }

    /* There is currently no ciphersuite using another length with TLS 1.2 */
#if defined(MBEDTLS_SSL_PROTO_SSL3)
    if( ssl->minor_ver == MBEDTLS_SSL_MINOR_VERSION_0 )
        hash_len = 36;
    else
#endif
        hash_len = 12;

    if( ssl->in_msg[0] != MBEDTLS_SSL_HS_FINISHED ||
        ssl->in_hslen  != mbedtls_ssl_hs_hdr_len( ssl ) + hash_len )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad finished message" ) );
        return( MBEDTLS_ERR_SSL_BAD_HS_FINISHED );
    }

    if( mbedtls_ssl_safer_memcmp( ssl->in_msg + mbedtls_ssl_hs_hdr_len( ssl ),
                      buf, hash_len ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad finished message" ) );
        return( MBEDTLS_ERR_SSL_BAD_HS_FINISHED );
    }

#if defined(MBEDTLS_SSL_RENEGOTIATION)
    ssl->verify_data_len = hash_len;
    memcpy( ssl->peer_verify_data, buf, hash_len );
#endif

    if( ssl->handshake->resume != 0 )
    {
#if defined(MBEDTLS_SSL_CLI_C)
        if( ssl->conf->endpoint == MBEDTLS_SSL_IS_CLIENT )
            ssl->state = MBEDTLS_SSL_CLIENT_CHANGE_CIPHER_SPEC;
#endif
#if defined(MBEDTLS_SSL_SRV_C)
        if( ssl->conf->endpoint == MBEDTLS_SSL_IS_SERVER )
            ssl->state = MBEDTLS_SSL_HANDSHAKE_WRAPUP;
#endif
    }
    else
        ssl->state++;

#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if( ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM )
        mbedtls_ssl_recv_flight_completed( ssl );
#endif

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= parse finished" ) );

    return( 0 );
}